

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

Aig_Man_t * Saig_ManUnrollCOI_(Aig_Man_t *p,int nFrames)

{
  Aig_Man_t *pAVar1;
  long lVar2;
  Aig_Obj_t **pObjMap;
  Aig_Obj_t **local_18;
  
  pAVar1 = Aig_ManFrames(p,nFrames,0,1,1,0,&local_18);
  if (0 < p->vObjs->nSize * nFrames) {
    lVar2 = 0;
    do {
      if ((local_18[lVar2] != (Aig_Obj_t *)0x0) &&
         ((*(byte *)(((ulong)local_18[lVar2] & 0xfffffffffffffffe) + 0x18) & 7) == 0)) {
        local_18[lVar2] = (Aig_Obj_t *)0x0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)p->vObjs->nSize * (long)nFrames);
  }
  if (p->pObjCopies == (Aig_Obj_t **)0x0) {
    p->pObjCopies = local_18;
    return pAVar1;
  }
  __assert_fail("p->pObjCopies == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigConstr2.c"
                ,0x19f,"Aig_Man_t *Saig_ManUnrollCOI_(Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManUnrollCOI_( Aig_Man_t * p, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t ** pObjMap;
    int i;
//Aig_Man_t * Aig_ManFrames( Aig_Man_t * pAig, int nFrames, int fInit, int fOuts, int fRegs, int fEnlarge, Aig_Obj_t *** ppObjMap )
    pFrames = Aig_ManFrames( p, nFrames, 0, 1, 1, 0, &pObjMap );
    for ( i = 0; i < nFrames * Aig_ManObjNumMax(p); i++ )
        if ( pObjMap[i] && Aig_ObjIsNone( Aig_Regular(pObjMap[i]) ) )
            pObjMap[i] = NULL;
    assert( p->pObjCopies == NULL );
    p->pObjCopies = pObjMap;
    return pFrames;
}